

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

Msat_Type_t
Msat_SolverSearch(Msat_Solver_t *p,int nConfLimit,int nLearnedLimit,int nBackTrackLimit,
                 Msat_SearchParams_t *pPars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  int local_64;
  int local_50;
  int i;
  int Value;
  int nAssigns;
  int nConfs;
  int nLevelBack;
  Msat_Var_t Var;
  Msat_Clause_t *pConf;
  Msat_SearchParams_t *pPars_local;
  int local_20;
  int nBackTrackLimit_local;
  int nLearnedLimit_local;
  int nConfLimit_local;
  Msat_Solver_t *p_local;
  
  pConf = (Msat_Clause_t *)pPars;
  pPars_local._4_4_ = nBackTrackLimit;
  local_20 = nLearnedLimit;
  nBackTrackLimit_local = nConfLimit;
  _nLearnedLimit_local = p;
  iVar1 = Msat_SolverReadDecisionLevel(p);
  if (iVar1 != _nLearnedLimit_local->nLevelRoot) {
    __assert_fail("Msat_SolverReadDecisionLevel(p) == p->nLevelRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                  ,0x21e,
                  "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                 );
  }
  (_nLearnedLimit_local->Stats).nStarts = (_nLearnedLimit_local->Stats).nStarts + 1;
  _nLearnedLimit_local->dVarDecay = 1.0 / (double)*pConf;
  _nLearnedLimit_local->dClaDecay = 1.0 / (double)pConf[1];
  for (local_50 = 0; local_50 < _nLearnedLimit_local->nVars; local_50 = local_50 + 1) {
    _nLearnedLimit_local->pdActivity[local_50] = (double)_nLearnedLimit_local->pFactors[local_50];
  }
  Value = 0;
  while( true ) {
    while (_nLevelBack = Msat_SolverPropagate(_nLearnedLimit_local),
          _nLevelBack != (Msat_Clause_t *)0x0) {
      if (_nLearnedLimit_local->fVerbose != 0) {
        iVar1 = Msat_SolverReadDecisionLevel(_nLearnedLimit_local);
        uVar2 = Msat_SolverReadDecisionLevel(_nLearnedLimit_local);
        printf("%-*d**CONFLICT**  ",(ulong)(iVar1 * 3 + 3),(ulong)uVar2);
        Msat_ClausePrintSymbols(_nLevelBack);
      }
      (_nLearnedLimit_local->Stats).nConflicts = (_nLearnedLimit_local->Stats).nConflicts + 1;
      Value = Value + 1;
      iVar1 = Msat_SolverReadDecisionLevel(_nLearnedLimit_local);
      if (iVar1 == _nLearnedLimit_local->nLevelRoot) {
        return MSAT_FALSE;
      }
      Msat_SolverAnalyze(_nLearnedLimit_local,_nLevelBack,_nLearnedLimit_local->vTemp,&nAssigns);
      if (nAssigns < _nLearnedLimit_local->nLevelRoot) {
        local_64 = _nLearnedLimit_local->nLevelRoot;
      }
      else {
        local_64 = nAssigns;
      }
      Msat_SolverCancelUntil(_nLearnedLimit_local,local_64);
      Msat_SolverRecord(_nLearnedLimit_local,_nLearnedLimit_local->vTemp);
      Msat_SolverVarDecayActivity(_nLearnedLimit_local);
      Msat_SolverClaDecayActivity(_nLearnedLimit_local);
    }
    Msat_IntVecReadSize(_nLearnedLimit_local->vTrailLim);
    iVar1 = Msat_IntVecReadSize(_nLearnedLimit_local->vTrail);
    if ((-1 < local_20) &&
       (iVar3 = Msat_ClauseVecReadSize(_nLearnedLimit_local->vLearned), local_20 + iVar1 <= iVar3))
    {
      Msat_SolverReduceDB(_nLearnedLimit_local);
    }
    nConfs = Msat_OrderVarSelect(_nLearnedLimit_local->pOrder);
    if (nConfs == -3) break;
    if ((0 < nBackTrackLimit_local) && (nBackTrackLimit_local < Value)) {
      dVar4 = Msat_SolverProgressEstimate(_nLearnedLimit_local);
      _nLearnedLimit_local->dProgress = dVar4;
      Msat_QueueClear(_nLearnedLimit_local->pQueue);
      Msat_SolverCancelUntil(_nLearnedLimit_local,_nLearnedLimit_local->nLevelRoot);
      return MSAT_UNKNOWN;
    }
    if ((0 < pPars_local._4_4_) &&
       (pPars_local._4_4_ <
        (int)(_nLearnedLimit_local->Stats).nConflicts - _nLearnedLimit_local->nBackTracks)) {
      Msat_QueueClear(_nLearnedLimit_local->pQueue);
      Msat_SolverCancelUntil(_nLearnedLimit_local,_nLearnedLimit_local->nLevelRoot);
      return MSAT_UNKNOWN;
    }
    (_nLearnedLimit_local->Stats).nDecisions = (_nLearnedLimit_local->Stats).nDecisions + 1;
    if (((nConfs == -3) || (nConfs < 0)) || (_nLearnedLimit_local->nVars <= nConfs)) {
      __assert_fail("Var != MSAT_ORDER_UNKNOWN && Var >= 0 && Var < p->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                    ,0x26c,
                    "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                   );
    }
    iVar1 = Msat_SolverAssume(_nLearnedLimit_local,nConfs << 1);
    if (iVar1 == 0) {
      __assert_fail("Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                    ,0x26e,
                    "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                   );
    }
  }
  memcpy(_nLearnedLimit_local->pModel,_nLearnedLimit_local->pAssigns,
         (long)_nLearnedLimit_local->nVars << 2);
  Msat_QueueClear(_nLearnedLimit_local->pQueue);
  Msat_SolverCancelUntil(_nLearnedLimit_local,_nLearnedLimit_local->nLevelRoot);
  return MSAT_TRUE;
}

Assistant:

Msat_Type_t Msat_SolverSearch( Msat_Solver_t * p, int nConfLimit, int nLearnedLimit, int nBackTrackLimit, Msat_SearchParams_t * pPars )
{
    Msat_Clause_t * pConf;
    Msat_Var_t Var;
    int nLevelBack, nConfs, nAssigns, Value;
    int i;

    assert( Msat_SolverReadDecisionLevel(p) == p->nLevelRoot );
    p->Stats.nStarts++;
    p->dVarDecay = 1 / pPars->dVarDecay;
    p->dClaDecay = 1 / pPars->dClaDecay;

    // reset the activities
    for ( i = 0; i < p->nVars; i++ )
       p->pdActivity[i] = (double)p->pFactors[i];
//       p->pdActivity[i] = 0.0;

    nConfs = 0;
    while ( 1 )
    {
        pConf = Msat_SolverPropagate( p );
        if ( pConf != NULL ){
            // CONFLICT
            if ( p->fVerbose )
            {
//                printf(L_IND"**CONFLICT**\n", L_ind);
                printf(L_IND"**CONFLICT**  ", L_ind);
                Msat_ClausePrintSymbols( pConf );
            }
            // count conflicts
            p->Stats.nConflicts++;
            nConfs++;

            // if top level, return UNSAT
            if ( Msat_SolverReadDecisionLevel(p) == p->nLevelRoot )
                return MSAT_FALSE;

            // perform conflict analysis
            Msat_SolverAnalyze( p, pConf, p->vTemp, &nLevelBack );
            Msat_SolverCancelUntil( p, (p->nLevelRoot > nLevelBack)? p->nLevelRoot : nLevelBack );
            Msat_SolverRecord( p, p->vTemp );

            // it is important that recording is done after cancelling
            // because canceling cleans the queue while recording adds to it
            Msat_SolverVarDecayActivity( p );
            Msat_SolverClaDecayActivity( p );

        }
        else{
            // NO CONFLICT
            if ( Msat_IntVecReadSize(p->vTrailLim) == 0 ) {
                // Simplify the set of problem clauses:
//                Value = Msat_SolverSimplifyDB(p);
//                assert( Value );
            }
            nAssigns = Msat_IntVecReadSize( p->vTrail );
            if ( nLearnedLimit >= 0 && Msat_ClauseVecReadSize(p->vLearned) >= nLearnedLimit + nAssigns ) {
                // Reduce the set of learnt clauses:
                Msat_SolverReduceDB(p);
            }

            Var = Msat_OrderVarSelect( p->pOrder );
            if ( Var == MSAT_ORDER_UNKNOWN ) {
                // Model found and stored in p->pAssigns
                memcpy( p->pModel, p->pAssigns, sizeof(int) * p->nVars );
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_TRUE;
            }
            if ( nConfLimit > 0 && nConfs > nConfLimit ) {
                // Reached bound on number of conflicts:
                p->dProgress = Msat_SolverProgressEstimate( p );
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_UNKNOWN; 
            }
            else if ( nBackTrackLimit > 0 && (int)p->Stats.nConflicts - p->nBackTracks > nBackTrackLimit ) {
                // Reached bound on number of conflicts:
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_UNKNOWN; 
            }
            else{
                // New variable decision:
                p->Stats.nDecisions++;
                assert( Var != MSAT_ORDER_UNKNOWN && Var >= 0 && Var < p->nVars );
                Value = Msat_SolverAssume(p, MSAT_VAR2LIT(Var,0) );
                assert( Value );
            }
        }
    }
}